

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

Txid * __thiscall CTransaction::ComputeHash(CTransaction *this)

{
  CTransaction *in_RSI;
  HashWriter *in_RDI;
  long in_FS_OFFSET;
  HashWriter *this_00;
  HashWriter local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.ctx.buf[0x30] = '\0';
  local_98.ctx.buf[0x31] = '\0';
  local_98.ctx.buf[0x32] = '\0';
  local_98.ctx.buf[0x33] = '\0';
  local_98.ctx.buf[0x34] = '\0';
  local_98.ctx.buf[0x35] = '\0';
  local_98.ctx.buf[0x36] = '\0';
  local_98.ctx.buf[0x37] = '\0';
  local_98.ctx.buf[0x38] = '\0';
  local_98.ctx.buf[0x39] = '\0';
  local_98.ctx.buf[0x3a] = '\0';
  local_98.ctx.buf[0x3b] = '\0';
  local_98.ctx.buf[0x3c] = '\0';
  local_98.ctx.buf[0x3d] = '\0';
  local_98.ctx.buf[0x3e] = '\0';
  local_98.ctx.buf[0x3f] = '\0';
  local_98.ctx.buf[0x20] = '\0';
  local_98.ctx.buf[0x21] = '\0';
  local_98.ctx.buf[0x22] = '\0';
  local_98.ctx.buf[0x23] = '\0';
  local_98.ctx.buf[0x24] = '\0';
  local_98.ctx.buf[0x25] = '\0';
  local_98.ctx.buf[0x26] = '\0';
  local_98.ctx.buf[0x27] = '\0';
  local_98.ctx.buf[0x28] = '\0';
  local_98.ctx.buf[0x29] = '\0';
  local_98.ctx.buf[0x2a] = '\0';
  local_98.ctx.buf[0x2b] = '\0';
  local_98.ctx.buf[0x2c] = '\0';
  local_98.ctx.buf[0x2d] = '\0';
  local_98.ctx.buf[0x2e] = '\0';
  local_98.ctx.buf[0x2f] = '\0';
  local_98.ctx.buf[0x10] = '\0';
  local_98.ctx.buf[0x11] = '\0';
  local_98.ctx.buf[0x12] = '\0';
  local_98.ctx.buf[0x13] = '\0';
  local_98.ctx.buf[0x14] = '\0';
  local_98.ctx.buf[0x15] = '\0';
  local_98.ctx.buf[0x16] = '\0';
  local_98.ctx.buf[0x17] = '\0';
  local_98.ctx.buf[0x18] = '\0';
  local_98.ctx.buf[0x19] = '\0';
  local_98.ctx.buf[0x1a] = '\0';
  local_98.ctx.buf[0x1b] = '\0';
  local_98.ctx.buf[0x1c] = '\0';
  local_98.ctx.buf[0x1d] = '\0';
  local_98.ctx.buf[0x1e] = '\0';
  local_98.ctx.buf[0x1f] = '\0';
  local_98.ctx.buf[0] = '\0';
  local_98.ctx.buf[1] = '\0';
  local_98.ctx.buf[2] = '\0';
  local_98.ctx.buf[3] = '\0';
  local_98.ctx.buf[4] = '\0';
  local_98.ctx.buf[5] = '\0';
  local_98.ctx.buf[6] = '\0';
  local_98.ctx.buf[7] = '\0';
  local_98.ctx.buf[8] = '\0';
  local_98.ctx.buf[9] = '\0';
  local_98.ctx.buf[10] = '\0';
  local_98.ctx.buf[0xb] = '\0';
  local_98.ctx.buf[0xc] = '\0';
  local_98.ctx.buf[0xd] = '\0';
  local_98.ctx.buf[0xe] = '\0';
  local_98.ctx.buf[0xf] = '\0';
  local_98.ctx.s[4] = 0;
  local_98.ctx.s[5] = 0;
  local_98.ctx.s[6] = 0;
  local_98.ctx.s[7] = 0;
  local_98.ctx.s[0] = 0;
  local_98.ctx.s[1] = 0;
  local_98.ctx.s[2] = 0;
  local_98.ctx.s[3] = 0;
  local_98.ctx.bytes = 0;
  this_00 = &local_98;
  HashWriter::HashWriter(in_RDI);
  TransactionSerParams::operator()((TransactionSerParams *)this_00,in_RSI);
  HashWriter::operator<<(this_00,(ParamsWrapper<TransactionSerParams,_const_CTransaction> *)in_RSI);
  HashWriter::GetHash((HashWriter *)&stack0xffffffffffffffd8);
  transaction_identifier<false>::FromUint256((uint256 *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Txid *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Txid CTransaction::ComputeHash() const
{
    return Txid::FromUint256((HashWriter{} << TX_NO_WITNESS(*this)).GetHash());
}